

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.cpp
# Opt level: O2

GdlRuleItem * __thiscall
GdlRule::RhsItemAt(GdlRule *this,GrpLineAndFile *lnf,int irit,string *staInput,string *staAlias,
                  bool fSubItem)

{
  pointer ppGVar1;
  pointer ppGVar2;
  GrcSymbolTable *pGVar3;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *pvVar4;
  string *psVar5;
  bool bVar6;
  GdlSetAttrItem *rit;
  Symbol psymInput;
  Symbol this_00;
  GdlSubstitutionItem *pGVar7;
  GdlRuleItem *pGVar8;
  GdlAlias *this_01;
  long lVar9;
  int iVar10;
  undefined7 in_register_00000089;
  GdlRule *pgdlobj;
  string *__lhs;
  GdlRuleItem *pritNew;
  vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *local_220;
  GrpLineAndFile *local_218;
  undefined4 local_20c;
  GdlRule *local_208;
  GdlSetAttrItem *local_200;
  int local_1f4;
  string *local_1f0;
  Symbol local_1e8;
  string *local_1e0;
  GdlAlias *local_1d8;
  string local_1d0 [32];
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110 [32];
  string local_f0 [32];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pGVar3 = g_cman.m_psymtbl;
  local_20c = (undefined4)CONCAT71(in_register_00000089,fSubItem);
  local_218 = lnf;
  local_1f4 = irit;
  local_1f0 = staInput;
  local_1e0 = staAlias;
  std::__cxx11::string::string((string *)&local_50,(string *)staInput);
  local_1e8 = GrcSymbolTable::FindSymbol(pGVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  rit = (GdlSetAttrItem *)&this->m_vprit;
  ppGVar1 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (this->m_vprit).super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  iVar10 = 0;
  lVar9 = 0;
  local_200 = (GdlSetAttrItem *)0x0;
  local_220 = (vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)rit;
  local_208 = this;
  do {
    this_00 = local_1e8;
    pgdlobj = local_208;
    __lhs = local_1e0;
    if ((long)ppGVar2 - (long)ppGVar1 >> 3 == lVar9) {
LAB_0014372d:
      psVar5 = local_1f0;
      bVar6 = std::operator==(local_1f0,"#");
      if (bVar6) {
        std::__cxx11::string::string
                  ((string *)&local_130,
                   "Line break indicator # cannot appear in the right-hand-side",
                   (allocator *)&pritNew);
        GrcErrorList::AddError(&g_errorList,0xc42,&pgdlobj->super_GdlObject,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        pritNew = (GdlRuleItem *)0x0;
      }
      else {
        if ((this_00 == (GrcSymbolTableEntry *)0x0) ||
           (((bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtClass), !bVar6 &&
             (bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialUnderscore), !bVar6))
            && (bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialAt), !bVar6)))) {
          std::__cxx11::string::string
                    ((string *)&local_150,"Undefined class name: ",(allocator *)&pritNew);
          std::__cxx11::string::string((string *)&local_170,(string *)psVar5);
          GrcErrorList::AddError
                    (&g_errorList,0xc43,&pgdlobj->super_GdlObject,&local_150,&local_170,local_218);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_150);
          pGVar3 = g_cman.m_psymtbl;
          GdlGlyphClassDefn::Undefined_abi_cxx11_();
          this_00 = GrcSymbolTable::FindSymbol(pGVar3,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        if (((ulong)local_200 & 1) != 0) {
          std::__cxx11::string::string
                    ((string *)&local_190,
                     "Context does not account for all items in the right-hand-side",
                     (allocator *)&pritNew);
          GrcErrorList::AddError(&g_errorList,0xc44,&pgdlobj->super_GdlObject,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
        }
        if ((char)local_20c == '\0') {
          pGVar7 = (GdlSubstitutionItem *)operator_new(0x98);
          GdlSetAttrItem::GdlSetAttrItem((GdlSetAttrItem *)pGVar7,this_00);
          pritNew = (GdlRuleItem *)pGVar7;
        }
        else {
          pGVar7 = (GdlSubstitutionItem *)operator_new(0xf0);
          pGVar3 = g_cman.m_psymtbl;
          std::__cxx11::string::string((string *)&local_1b0,"_",(allocator *)&local_1d8);
          psymInput = GrcSymbolTable::FindSymbol(pGVar3,&local_1b0);
          GdlSubstitutionItem::GdlSubstitutionItem(pGVar7,psymInput,this_00);
          pritNew = (GdlRuleItem *)pGVar7;
          std::__cxx11::string::~string((string *)&local_1b0);
        }
        GrpLineAndFile::operator=
                  (&(pGVar7->super_GdlSetAttrItem).super_GdlRuleItem.super_GdlObject.m_lnf,local_218
                  );
        pGVar8 = pritNew;
        iVar10 = (int)((ulong)((long)(pgdlobj->m_vprit).
                                     super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pgdlobj->m_vprit).
                                    super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
        pritNew->m_iritContextPos = iVar10;
        pritNew->m_iritContextPosOrig = iVar10;
        bVar6 = std::operator!=(__lhs,"");
        if (bVar6) {
          this_01 = (GdlAlias *)operator_new(0x28);
          std::__cxx11::string::string(local_1d0,(string *)__lhs);
          iVar10 = pGVar8->m_iritContextPos;
          std::__cxx11::string::string((string *)this_01,local_1d0);
          this_01->m_srIndex = iVar10 + 1;
          local_1d8 = this_01;
          std::vector<GdlAlias*,std::allocator<GdlAlias*>>::emplace_back<GdlAlias*>
                    ((vector<GdlAlias*,std::allocator<GdlAlias*>> *)&pgdlobj->m_vpalias,&local_1d8);
          std::__cxx11::string::~string(local_1d0);
        }
        std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::push_back(local_220,&pritNew);
      }
      return pritNew;
    }
    pGVar8 = ppGVar1[lVar9];
    if ((pGVar8 == (GdlRuleItem *)0x0) ||
       (rit = (GdlSetAttrItem *)
              __dynamic_cast(pGVar8,&GdlRuleItem::typeinfo,&GdlSetAttrItem::typeinfo,0),
       __lhs = local_1e0, this_00 = local_1e8, pgdlobj = local_208, rit == (GdlSetAttrItem *)0x0)) {
      rit = (GdlSetAttrItem *)CONCAT71((int7)((ulong)rit >> 8),1);
      local_200 = rit;
    }
    else {
      if (iVar10 == local_1f4) {
        if ((local_1e8 == (GrcSymbolTableEntry *)0x0) ||
           ((((bVar6 = GrcSymbolTableEntry::FitsSymbolType(local_1e8,ksymtClass), !bVar6 &&
              (bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialUnderscore), !bVar6))
             && (bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialLb), !bVar6)) &&
            (bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialAt), !bVar6)))) {
          std::__cxx11::string::string
                    ((string *)&local_b0,"Undefined class name: ",(allocator *)&pritNew);
          std::__cxx11::string::string((string *)&local_d0,(string *)local_1f0);
          GrcErrorList::AddError
                    (&g_errorList,0xc41,&pgdlobj->super_GdlObject,&local_b0,&local_d0,local_218);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          pGVar3 = g_cman.m_psymtbl;
          GdlGlyphClassDefn::Undefined_abi_cxx11_();
          this_00 = GrcSymbolTable::FindSymbol(pGVar3,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          pgdlobj = local_208;
        }
        bVar6 = GrcSymbolTableEntry::FitsSymbolType(this_00,ksymtSpecialLb);
        pvVar4 = local_220;
        if (!bVar6) {
          if ((char)local_20c != '\0') {
            pGVar7 = (GdlSubstitutionItem *)operator_new(0xf0);
            GdlSubstitutionItem::GdlSubstitutionItem(pGVar7,rit);
            GrpLineAndFile::operator=
                      (&(pGVar7->super_GdlSetAttrItem).super_GdlRuleItem.super_GdlObject.m_lnf,
                       local_218);
            pGVar7->m_psymOutput = this_00;
            (pGVar7->super_GdlSetAttrItem).super_GdlRuleItem.m_psymInput = (Symbol)0x0;
            bVar6 = std::operator!=(__lhs,"");
            if (bVar6) {
              pGVar8 = (GdlRuleItem *)operator_new(0x28);
              std::__cxx11::string::string(local_f0,(string *)__lhs);
              iVar10 = (local_220->super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar9]->m_iritContextPos;
              std::__cxx11::string::string((string *)pGVar8,local_f0);
              *(int *)&(pGVar8->super_GdlObject).m_lnf.m_staFile.field_2 = iVar10 + 1;
              pritNew = pGVar8;
              std::vector<GdlAlias*,std::allocator<GdlAlias*>>::emplace_back<GdlAlias*>
                        ((vector<GdlAlias*,std::allocator<GdlAlias*>> *)&local_208->m_vpalias,
                         (GdlAlias **)&pritNew);
              std::__cxx11::string::~string(local_f0);
            }
            (*(rit->super_GdlRuleItem)._vptr_GdlRuleItem[2])(rit);
            (local_220->super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar9] = (GdlRuleItem *)pGVar7;
            return (GdlRuleItem *)pGVar7;
          }
          GrpLineAndFile::operator=
                    (&((local_220->super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar9]->super_GdlObject).m_lnf,
                     local_218);
          (pvVar4->super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar9]->m_psymInput = this_00;
          bVar6 = std::operator!=(__lhs,"");
          if (bVar6) {
            pGVar8 = (GdlRuleItem *)operator_new(0x28);
            std::__cxx11::string::string(local_110,(string *)__lhs);
            iVar10 = (local_220->super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar9]->m_iritContextPos;
            std::__cxx11::string::string((string *)pGVar8,local_110);
            *(int *)&(pGVar8->super_GdlObject).m_lnf.m_staFile.field_2 = iVar10 + 1;
            pritNew = pGVar8;
            std::vector<GdlAlias*,std::allocator<GdlAlias*>>::emplace_back<GdlAlias*>
                      ((vector<GdlAlias*,std::allocator<GdlAlias*>> *)&pgdlobj->m_vpalias,
                       (GdlAlias **)&pritNew);
            std::__cxx11::string::~string(local_110);
          }
          return (local_220->super__Vector_base<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        }
        goto LAB_0014372d;
      }
      iVar10 = iVar10 + 1;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

GdlRuleItem * GdlRule::RhsItemAt(GrpLineAndFile & lnf, int irit,
	std::string staInput, std::string staAlias, bool fSubItem)
{
	bool fContext = false;
	int critRhs = 0;

	Symbol psymClassOrPlaceHolder = g_cman.SymbolTable()->FindSymbol(staInput);

	for (size_t iritT = 0; iritT < m_vprit.size(); iritT++)
	{
		GdlSetAttrItem * pritset = dynamic_cast<GdlSetAttrItem*>(m_vprit[iritT]);
		if (!pritset)
			fContext = true;
		else
		{
			if (irit == critRhs)
			{
				if (!psymClassOrPlaceHolder || 
					(!psymClassOrPlaceHolder->FitsSymbolType(ksymtClass) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialUnderscore) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialLb) &&
						!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialAt)))
				{
					g_errorList.AddError(3137, this,
						"Undefined class name: ",
						staInput,
						lnf);
					psymClassOrPlaceHolder =
						g_cman.SymbolTable()->FindSymbol(GdlGlyphClassDefn::Undefined());
				}

				if (psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialLb))
				{
					goto LLbError;
				}
				else if (fSubItem)
				{
					GdlSubstitutionItem * pritsub = new GdlSubstitutionItem(*pritset);
					pritsub->SetLineAndFile(lnf);
					pritsub->m_psymOutput = psymClassOrPlaceHolder;
					pritsub->m_psymInput = NULL;	// must be set by LHS

					//	record the 1-based slot-alias value, if any
					if (staAlias != "")
						m_vpalias.push_back(
							new GdlAlias(staAlias, m_vprit[iritT]->m_iritContextPos + 1));

					delete pritset;
					m_vprit[iritT] = pritsub;
					return pritsub;
				}

				else
				{
					m_vprit[iritT]->SetLineAndFile(lnf);
					m_vprit[iritT]->m_psymInput = psymClassOrPlaceHolder;

					//	record the 1-based slot-alias value, if any
					if (staAlias != "")
						m_vpalias.push_back(
							new GdlAlias(staAlias, m_vprit[iritT]->m_iritContextPos + 1));

					return m_vprit[iritT];
				}
			}

			else
				critRhs++;
		}
	}

	//	Need to add an item

LLbError:
	if (staInput == "#")
	{
		g_errorList.AddError(3138, this,
			"Line break indicator # cannot appear in the right-hand-side");
		return NULL;
	}

	if (!psymClassOrPlaceHolder ||
		(!psymClassOrPlaceHolder->FitsSymbolType(ksymtClass) &&
			!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialUnderscore) &&
			!psymClassOrPlaceHolder->FitsSymbolType(ksymtSpecialAt)))
	{
		g_errorList.AddError(3139, this,
			"Undefined class name: ",
			staInput,
			lnf);
		psymClassOrPlaceHolder = g_cman.SymbolTable()->FindSymbol(GdlGlyphClassDefn::Undefined());
	}

	//	Record an error if there was a context for this rule--then pretend that
	//	there was an extra _ on the end of the context.
	if (fContext)
	{
		g_errorList.AddError(3140, this,
			"Context does not account for all items in the right-hand-side");
	}

	GdlRuleItem * pritNew;
	if (fSubItem)
		pritNew = new GdlSubstitutionItem(
			g_cman.SymbolTable()->FindSymbol("_"),
			psymClassOrPlaceHolder);
	else
		pritNew = new GdlSetAttrItem(psymClassOrPlaceHolder);

	pritNew->SetLineAndFile(lnf);
	pritNew->m_iritContextPos = int(m_vprit.size());
	pritNew->m_iritContextPosOrig = pritNew->m_iritContextPos;

	//	record the 1-based slot-alias value, if any
	if (staAlias != "")
		m_vpalias.push_back(new GdlAlias(staAlias, pritNew->m_iritContextPos + 1));

	m_vprit.push_back(pritNew);
	return pritNew;
}